

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.c
# Opt level: O0

int rsa_alt_sign_wrap(void *ctx,mbedtls_md_type_t md_alg,uchar *hash,size_t hash_len,uchar *sig,
                     size_t *sig_len,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  size_t sVar1;
  mbedtls_rsa_alt_context *rsa_alt;
  size_t *sig_len_local;
  uchar *sig_local;
  size_t hash_len_local;
  uchar *hash_local;
  mbedtls_md_type_t md_alg_local;
  void *ctx_local;
  
  if (hash_len < 0x100000000) {
    sVar1 = (**(code **)((long)ctx + 0x18))(*ctx);
    *sig_len = sVar1;
    ctx_local._4_4_ =
         (**(code **)((long)ctx + 0x10))(*ctx,f_rng,p_rng,1,md_alg,hash_len & 0xffffffff,hash,sig);
  }
  else {
    ctx_local._4_4_ = -16000;
  }
  return ctx_local._4_4_;
}

Assistant:

static int rsa_alt_sign_wrap( void *ctx, mbedtls_md_type_t md_alg,
                   const unsigned char *hash, size_t hash_len,
                   unsigned char *sig, size_t *sig_len,
                   int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    mbedtls_rsa_alt_context *rsa_alt = (mbedtls_rsa_alt_context *) ctx;

#if defined(MBEDTLS_HAVE_INT64)
    if( UINT_MAX < hash_len )
        return( MBEDTLS_ERR_PK_BAD_INPUT_DATA );
#endif /* MBEDTLS_HAVE_INT64 */

    *sig_len = rsa_alt->key_len_func( rsa_alt->key );

    return( rsa_alt->sign_func( rsa_alt->key, f_rng, p_rng, MBEDTLS_RSA_PRIVATE,
                md_alg, (unsigned int) hash_len, hash, sig ) );
}